

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TreeEnsembleParameters_TreeNode_EvaluationInfo * __thiscall
google::protobuf::Arena::
DoCreateMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>(Arena *this)

{
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_00;
  
  this_00 = (TreeEnsembleParameters_TreeNode_EvaluationInfo *)
            AllocateAlignedWithHook
                      (this,0x28,
                       (type_info *)
                       &CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
                        typeinfo);
  CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
  TreeEnsembleParameters_TreeNode_EvaluationInfo(this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }